

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool __thiscall QCss::Parser::parseCombinator(Parser *this,Relation *relation)

{
  Relation RVar1;
  bool bVar2;
  TokenType TVar3;
  
  *relation = NoRelation;
  TVar3 = lookup(this);
  if (TVar3 == S) {
    *relation = MatchNextSelectorIfAncestor;
    skipSpace(this);
  }
  else {
    this->index = this->index + -1;
  }
  bVar2 = test(this,PLUS);
  if (bVar2) {
    RVar1 = MatchNextSelectorIfDirectAdjecent;
  }
  else {
    bVar2 = test(this,GREATER);
    if (bVar2) {
      RVar1 = MatchNextSelectorIfParent;
    }
    else {
      bVar2 = test(this,TILDE);
      if (!bVar2) goto LAB_00546b50;
      RVar1 = MatchNextSelectorIfIndirectAdjecent;
    }
  }
  *relation = RVar1;
LAB_00546b50:
  skipSpace(this);
  return true;
}

Assistant:

bool Parser::parseCombinator(BasicSelector::Relation *relation)
{
    *relation = BasicSelector::NoRelation;
    if (lookup() == S) {
        *relation = BasicSelector::MatchNextSelectorIfAncestor;
        skipSpace();
    } else {
        prev();
    }
    if (test(PLUS)) {
        *relation = BasicSelector::MatchNextSelectorIfDirectAdjecent;
    } else if (test(GREATER)) {
        *relation = BasicSelector::MatchNextSelectorIfParent;
    } else if (test(TILDE)) {
        *relation = BasicSelector::MatchNextSelectorIfIndirectAdjecent;
    }
    skipSpace();
    return true;
}